

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall cs_impl::any::make<cs::structure,cs::structure_const*>(any *this,structure **args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_0025ce90 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x50);
  }
  else {
    pbVar1 = *(baseHolder **)(&show_version_info + DAT_0025ce90 * 8);
    DAT_0025ce90 = DAT_0025ce90 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_00255728;
  cs::structure::structure((structure *)(pbVar1 + 1),*args);
  if ((DAT_0025fe20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_0025fe20];
    DAT_0025fe20 = DAT_0025fe20 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}